

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

void __thiscall
duckdb::RegexpMatchesBindData::RegexpMatchesBindData
          (RegexpMatchesBindData *this,Options options,string *constant_string_p,
          bool constant_pattern)

{
  string *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer pRVar7;
  InvalidInputException *this_00;
  templated_unique_single_t pattern;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  uVar2 = options._8_8_;
  uVar4 = options._16_8_;
  pattern.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
  super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>.
  super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl =
       (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>)
       (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>)options.max_mem_;
  ::std::__cxx11::string::string((string *)&local_50,(string *)constant_string_p);
  uVar5 = options._16_8_;
  uVar3 = options._8_8_;
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__RegexpBaseBindData_027949f0;
  (this->super_RegexpBaseBindData).options.max_mem_ =
       (int64_t)pattern.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>.
                _M_t.super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>.
                super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl;
  options.encoding_ = (Encoding)uVar2;
  options.posix_syntax_ = SUB81(uVar2,4);
  options.longest_match_ = SUB81(uVar2,5);
  options.log_errors_ = SUB81(uVar2,6);
  options.literal_ = SUB81(uVar2,7);
  (this->super_RegexpBaseBindData).options.encoding_ = options.encoding_;
  (this->super_RegexpBaseBindData).options.posix_syntax_ = options.posix_syntax_;
  (this->super_RegexpBaseBindData).options.longest_match_ = options.longest_match_;
  (this->super_RegexpBaseBindData).options.log_errors_ = options.log_errors_;
  (this->super_RegexpBaseBindData).options.literal_ = options.literal_;
  options.never_nl_ = SUB81(uVar4,0);
  options.dot_nl_ = SUB81(uVar4,1);
  options.never_capture_ = SUB81(uVar4,2);
  options.case_sensitive_ = SUB81(uVar4,3);
  options.perl_classes_ = SUB81(uVar4,4);
  options.word_boundary_ = SUB81(uVar4,5);
  options.one_line_ = SUB81(uVar4,6);
  options._23_1_ = SUB81(uVar4,7);
  (this->super_RegexpBaseBindData).options.never_nl_ = options.never_nl_;
  (this->super_RegexpBaseBindData).options.dot_nl_ = options.dot_nl_;
  (this->super_RegexpBaseBindData).options.never_capture_ = options.never_capture_;
  (this->super_RegexpBaseBindData).options.case_sensitive_ = options.case_sensitive_;
  (this->super_RegexpBaseBindData).options.perl_classes_ = options.perl_classes_;
  (this->super_RegexpBaseBindData).options.word_boundary_ = options.word_boundary_;
  (this->super_RegexpBaseBindData).options.one_line_ = options.one_line_;
  (this->super_RegexpBaseBindData).options.field_0x17 = options._23_1_;
  args = &(this->super_RegexpBaseBindData).constant_string;
  paVar1 = &(this->super_RegexpBaseBindData).constant_string.field_2;
  (this->super_RegexpBaseBindData).constant_string._M_dataplus._M_p = (pointer)paVar1;
  if (local_50 == &local_40) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(this->super_RegexpBaseBindData).constant_string.field_2 + 8) = uStack_38
    ;
  }
  else {
    (args->_M_dataplus)._M_p = local_50;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (this->super_RegexpBaseBindData).constant_string._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  (this->super_RegexpBaseBindData).constant_pattern = constant_pattern;
  options._8_8_ = uVar3;
  options._16_8_ = uVar5;
  local_50 = &local_40;
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__RegexpMatchesBindData_02794a20;
  (this->range_min)._M_dataplus._M_p = (pointer)&(this->range_min).field_2;
  (this->range_min)._M_string_length = 0;
  (this->range_min).field_2._M_local_buf[0] = '\0';
  (this->range_max)._M_dataplus._M_p = (pointer)&(this->range_max).field_2;
  (this->range_max)._M_string_length = 0;
  (this->range_max).field_2._M_local_buf[0] = '\0';
  if (constant_pattern) {
    make_uniq<duckdb_re2::RE2,std::__cxx11::string&,duckdb_re2::RE2::Options&>
              ((duckdb *)&pattern,args,&options);
    pRVar7 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                       (&pattern);
    if ((*(uint *)&pRVar7->field_0x44 & 0x1fffffff) != 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      pRVar7 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                         (&pattern);
      InvalidInputException::InvalidInputException(this_00,(string *)pRVar7->error_);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pRVar7 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::operator->
                       (&pattern);
    bVar6 = duckdb_re2::RE2::PossibleMatchRange(pRVar7,&this->range_min,&this->range_max,1000);
    this->range_success = bVar6;
    ::std::unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::~unique_ptr
              (&pattern.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>);
  }
  else {
    this->range_success = false;
  }
  return;
}

Assistant:

RegexpMatchesBindData::RegexpMatchesBindData(duckdb_re2::RE2::Options options, string constant_string_p,
                                             bool constant_pattern)
    : RegexpBaseBindData(options, std::move(constant_string_p), constant_pattern) {
	if (constant_pattern) {
		auto pattern = make_uniq<RE2>(constant_string, options);
		if (!pattern->ok()) {
			throw InvalidInputException(pattern->error());
		}

		range_success = pattern->PossibleMatchRange(&range_min, &range_max, 1000);
	} else {
		range_success = false;
	}
}